

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall Loop::CanDoFieldCopyProp(Loop *this)

{
  bool bVar1;
  LabelInstr *pLVar2;
  ulong uVar3;
  
  if ((this->implicitCallFlags & ~ImplicitCall_External) == ImplicitCall_HasNoInfo) {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,HostOptPhase);
    if (bVar1) {
      pLVar2 = GetLoopTopInstr(this);
      uVar3 = 0xffffffff;
      if ((pLVar2->super_Instr).m_kind == InstrKindProfiledLabel) {
        uVar3 = (ulong)*(uint *)((long)&pLVar2[1].super_Instr._vptr_Instr + 4);
      }
      Output::Print(L"fieldcopyprop disabled because external: loop count: %d",uVar3);
      pLVar2 = GetLoopTopInstr(this);
      Func::DumpFullFunctionName((pLVar2->super_Instr).m_func);
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  bVar1 = GlobOpt::ImplicitCallFlagsAllowOpts(this);
  return bVar1;
}

Assistant:

bool
Loop::CanDoFieldCopyProp()
{
#if DBG_DUMP
    if (((this->implicitCallFlags & ~(Js::ImplicitCall_External)) == 0) &&
        Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostOptPhase))
    {
        Output::Print(_u("fieldcopyprop disabled because external: loop count: %d"), GetLoopNumber());
        GetFunc()->DumpFullFunctionName();
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif
    return GlobOpt::ImplicitCallFlagsAllowOpts(this);
}